

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

void gc_mark(global_State *g,GCobj *o)

{
  byte bVar1;
  GCupval *uv;
  GCobj *pGVar2;
  
  bVar1 = (o->gch).marked;
LAB_0010d9ef:
  (o->gch).marked = bVar1 & 0xfc;
  switch((o->gch).gct) {
  case '\x04':
  case '\n':
    return;
  case '\x05':
    if ((((int)(((o->th).base)->field_4).it >> 0xf) + 0xdU < 9) &&
       (pGVar2 = (GCobj *)((ulong)((o->th).base)->field_4 & 0x7fffffffffff),
       ((pGVar2->gch).marked & 3) != 0)) {
      gc_mark(g,pGVar2);
    }
    if ((o->gch).unused1 == '\0') {
      return;
    }
    (o->gch).marked = (o->gch).marked | 4;
    return;
  default:
    (o->gch).gclist.gcptr64 = (g->gc).gray.gcptr64;
    (g->gc).gray.gcptr64 = (uint64_t)o;
    return;
  case '\f':
    break;
  }
  pGVar2 = (GCobj *)(o->th).base;
  (o->gch).marked = bVar1 & 0xfc | 4;
  if ((pGVar2 != (GCobj *)0x0) && (((pGVar2->gch).marked & 3) != 0)) {
    gc_mark(g,pGVar2);
  }
  pGVar2 = (GCobj *)(o->gch).env.gcptr64;
  if (((pGVar2->gch).marked & 3) != 0) {
    gc_mark(g,pGVar2);
  }
  if ((o->gch).unused1 != '\x03') {
    return;
  }
  if (((((o->th).env.gcptr64 & 2) != 0) &&
      (pGVar2 = (GCobj *)(o->th).cframe, pGVar2 != (GCobj *)0x0)) &&
     (((pGVar2->gch).marked & 3) != 0)) {
    gc_mark(g,pGVar2);
  }
  pGVar2 = (GCobj *)(o->th).exdata;
  if ((pGVar2 != (GCobj *)0x0) && (((pGVar2->gch).marked & 3) != 0)) {
    gc_mark(g,pGVar2);
  }
  o = (GCobj *)(o->th).exdata2;
  if (o == (GCobj *)0x0) {
    return;
  }
  bVar1 = (o->gch).marked;
  if ((bVar1 & 3) == 0) {
    return;
  }
  goto LAB_0010d9ef;
}

Assistant:

static void gc_mark(global_State *g, GCobj *o)
{
  int gct = o->gch.gct;
  lj_assertG(iswhite(o), "mark of non-white object");
  lj_assertG(!isdead(g, o), "mark of dead object");
  white2gray(o);
  if (LJ_UNLIKELY(gct == ~LJ_TUDATA)) {
    GCtab *mt = tabref(gco2ud(o)->metatable);
    gray2black(o);  /* Userdata are never gray. */
    if (mt) gc_markobj(g, mt);
    gc_markobj(g, tabref(gco2ud(o)->env));
    if (LJ_HASBUFFER && gco2ud(o)->udtype == UDTYPE_BUFFER) {
      SBufExt *sbx = (SBufExt *)uddata(gco2ud(o));
      if (sbufiscow(sbx) && gcref(sbx->cowref))
	gc_markobj(g, gcref(sbx->cowref));
      if (gcref(sbx->dict_str))
	gc_markobj(g, gcref(sbx->dict_str));
      if (gcref(sbx->dict_mt))
	gc_markobj(g, gcref(sbx->dict_mt));
    }
  } else if (LJ_UNLIKELY(gct == ~LJ_TUPVAL)) {
    GCupval *uv = gco2uv(o);
    gc_marktv(g, uvval(uv));
    if (uv->closed)
      gray2black(o);  /* Closed upvalues are never gray. */
  } else if (gct != ~LJ_TSTR && gct != ~LJ_TCDATA) {
    lj_assertG(gct == ~LJ_TFUNC || gct == ~LJ_TTAB ||
	       gct == ~LJ_TTHREAD || gct == ~LJ_TPROTO || gct == ~LJ_TTRACE,
	       "bad GC type %d", gct);
    setgcrefr(o->gch.gclist, g->gc.gray);
    setgcref(g->gc.gray, o);
  }
}